

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_enlarge_face(REF_CAVITY ref_cavity,REF_INT face)

{
  REF_GRID pRVar1;
  REF_NODE pRVar2;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT tet1;
  REF_INT tet0;
  REF_BOOL have_cell1;
  REF_BOOL have_cell0;
  REF_INT node;
  REF_INT face_nodes [4];
  REF_INT face_node;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT face_local;
  REF_CAVITY ref_cavity_local;
  
  pRVar1 = ref_cavity->ref_grid;
  pRVar2 = pRVar1->node;
  if (((face < 0) || (ref_cavity->maxface <= face)) || (ref_cavity->f2n[face * 3] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x7f0,
           "ref_cavity_enlarge_face","invalid face");
    ref_cavity_local._4_4_ = 1;
  }
  else {
    for (face_nodes[3] = 0; face_nodes[3] < 3; face_nodes[3] = face_nodes[3] + 1) {
      have_cell1 = ref_cavity->f2n[face_nodes[3] + face * 3];
      if (pRVar2->ref_mpi->id != pRVar2->part[have_cell1]) {
        ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
        return 0;
      }
    }
    for (face_nodes[3] = 0; face_nodes[3] < 3; face_nodes[3] = face_nodes[3] + 1) {
      have_cell1 = ref_cavity->f2n[face_nodes[3] + face * 3];
      if ((have_cell1 < 0) || (pRVar1->cell[9]->ref_adj->nnode <= have_cell1)) {
        local_74 = -1;
      }
      else {
        local_74 = pRVar1->cell[9]->ref_adj->first[have_cell1];
      }
      if (local_74 != -1) {
LAB_001efb91:
        ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
        return 0;
      }
      if ((have_cell1 < 0) || (pRVar1->cell[10]->ref_adj->nnode <= have_cell1)) {
        local_78 = -1;
      }
      else {
        local_78 = pRVar1->cell[10]->ref_adj->first[have_cell1];
      }
      if (local_78 != -1) goto LAB_001efb91;
      if ((have_cell1 < 0) || (pRVar1->cell[0xb]->ref_adj->nnode <= have_cell1)) {
        local_7c = -1;
      }
      else {
        local_7c = pRVar1->cell[0xb]->ref_adj->first[have_cell1];
      }
      if (local_7c != -1) goto LAB_001efb91;
      if ((have_cell1 < 0) || (pRVar1->cell[6]->ref_adj->nnode <= have_cell1)) {
        local_80 = -1;
      }
      else {
        local_80 = pRVar1->cell[6]->ref_adj->first[have_cell1];
      }
      if (local_80 != -1) goto LAB_001efb91;
    }
    have_cell0 = ref_cavity->f2n[face * 3];
    node = ref_cavity->f2n[face * 3 + 1];
    face_nodes[0] = ref_cavity->f2n[face * 3 + 2];
    face_nodes[1] = have_cell0;
    ref_cavity_local._4_4_ =
         ref_cell_with_face(pRVar1->cell[8],&have_cell0,&ref_private_macro_code_rsb,
                            &ref_private_macro_code_rss);
    if (ref_cavity_local._4_4_ == 0) {
      if (ref_private_macro_code_rsb == -1) {
        ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
        ref_cavity_local._4_4_ = 0;
      }
      else if (ref_private_macro_code_rss == -1) {
        ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
        ref_cavity_local._4_4_ = 0;
      }
      else {
        ref_cavity_local._4_4_ =
             ref_list_contains(ref_cavity->tet_list,ref_private_macro_code_rsb,&tet0);
        if (ref_cavity_local._4_4_ == 0) {
          ref_cavity_local._4_4_ =
               ref_list_contains(ref_cavity->tet_list,ref_private_macro_code_rss,&tet1);
          if (ref_cavity_local._4_4_ == 0) {
            if ((tet0 == 0) ||
               (ref_cavity_local._4_4_ = ref_cavity_add_tet(ref_cavity,ref_private_macro_code_rss),
               ref_cavity_local._4_4_ == 0)) {
              if ((tet1 == 0) ||
                 (ref_cavity_local._4_4_ = ref_cavity_add_tet(ref_cavity,ref_private_macro_code_rsb)
                 , ref_cavity_local._4_4_ == 0)) {
                ref_cavity_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x822,"ref_cavity_enlarge_face",(ulong)ref_cavity_local._4_4_,"add c0");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x821,"ref_cavity_enlarge_face",(ulong)ref_cavity_local._4_4_,"add c1");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x820,"ref_cavity_enlarge_face",(ulong)ref_cavity_local._4_4_,"cell1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x81e,"ref_cavity_enlarge_face",(ulong)ref_cavity_local._4_4_,"cell0");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x813,"ref_cavity_enlarge_face",(ulong)ref_cavity_local._4_4_,
             "found too many tets with face_nodes");
      printf("%d face_nodes %d %d %d %d\n%f %f %f\n",pRVar2->real[have_cell0 * 0xf],
             pRVar2->real[have_cell0 * 0xf + 1],pRVar2->real[have_cell0 * 0xf + 2],(ulong)(uint)face
             ,(ulong)(uint)have_cell0,(ulong)(uint)node,(ulong)(uint)face_nodes[0],
             (ulong)(uint)face_nodes[1]);
      ref_cavity_tec(ref_cavity,"ref_cavity_too_many_tet.tec");
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_face(REF_CAVITY ref_cavity,
                                           REF_INT face) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT face_node, face_nodes[4], node;
  REF_BOOL have_cell0, have_cell1;
  REF_INT tet0, tet1;

  RAS(ref_cavity_valid_face(ref_cavity, face), "invalid face");

  /* make sure all face nodes are owned */
  each_ref_cavity_face_node(ref_cavity, face_node) {
    node = ref_cavity_f2n(ref_cavity, face_node, face);
    if (!ref_node_owned(ref_node, node)) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
  }

  /* make sure all face nodes are tet */
  each_ref_cavity_face_node(ref_cavity, face_node) {
    node = ref_cavity_f2n(ref_cavity, face_node, face);
    if (!(ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
          ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
          ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node) &&
          ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node))) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
      return REF_SUCCESS;
    }
  }

  face_nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
  face_nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
  face_nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
  face_nodes[3] = face_nodes[0];
  RSB(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0, &tet1),
      "found too many tets with face_nodes", {
        printf("%d face_nodes %d %d %d %d\n%f %f %f\n", face, face_nodes[0],
               face_nodes[1], face_nodes[2], face_nodes[3],
               ref_node_xyz(ref_node, 0, face_nodes[0]),
               ref_node_xyz(ref_node, 1, face_nodes[0]),
               ref_node_xyz(ref_node, 2, face_nodes[0]));
        ref_cavity_tec(ref_cavity, "ref_cavity_too_many_tet.tec");
      });
  if (REF_EMPTY == tet0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
    return REF_SUCCESS;
  }
  if (REF_EMPTY == tet1) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet0, &have_cell0),
      "cell0");
  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet1, &have_cell1),
      "cell1");
  if (have_cell0) RSS(ref_cavity_add_tet(ref_cavity, tet1), "add c1");
  if (have_cell1) RSS(ref_cavity_add_tet(ref_cavity, tet0), "add c0");

  return REF_SUCCESS;
}